

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::IdealDiffuseBxDF::ToString_abi_cxx11_(string *__return_storage_ptr__,IdealDiffuseBxDF *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,"[ IdealDiffuseBxDF R: %s ]",&this->R);
  return __return_storage_ptr__;
}

Assistant:

std::string IdealDiffuseBxDF::ToString() const {
    return StringPrintf("[ IdealDiffuseBxDF R: %s ]", R);
}